

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O0

bool __thiscall RenX::Server::removePlayer(Server *this,int id)

{
  Plugin *pPVar1;
  bool bVar2;
  size_type sVar3;
  pointer pPVar4;
  Core *this_00;
  vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_> *this_01;
  reference ppPVar5;
  reference pPVar6;
  const_iterator local_58;
  Plugin *local_50;
  Plugin *plugin;
  iterator __end3;
  iterator __begin3;
  vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_> *__range3;
  _Self local_28;
  iterator node;
  int id_local;
  Server *this_local;
  
  node._M_node._4_4_ = id;
  sVar3 = std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::size
                    (&this->players);
  if (sVar3 != 0) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::begin
                   (&this->players);
    while( true ) {
      __range3 = (vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_> *)
                 std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::end
                           (&this->players);
      bVar2 = std::operator==(&local_28,(_Self *)&__range3);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      pPVar4 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_28);
      if (pPVar4->id == node._M_node._4_4_) {
        this_00 = getCore();
        this_01 = Core::getPlugins(this_00);
        __end3 = std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>::begin(this_01);
        plugin = (Plugin *)
                 std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>::end(this_01);
        while (bVar2 = __gnu_cxx::
                       operator==<RenX::Plugin_**,_std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>_>
                                 (&__end3,(__normal_iterator<RenX::Plugin_**,_std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>_>
                                           *)&plugin), ((bVar2 ^ 0xffU) & 1) != 0) {
          ppPVar5 = __gnu_cxx::
                    __normal_iterator<RenX::Plugin_**,_std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>_>
                    ::operator*(&__end3);
          pPVar1 = *ppPVar5;
          local_50 = pPVar1;
          pPVar6 = std::_List_iterator<RenX::PlayerInfo>::operator*(&local_28);
          (**(code **)(*(long *)pPVar1 + 0xf8))(pPVar1,this,pPVar6);
          __gnu_cxx::
          __normal_iterator<RenX::Plugin_**,_std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>_>
          ::operator++(&__end3);
        }
        pPVar4 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_28);
        if ((pPVar4->isBot & 1U) != 0) {
          this->m_bot_count = this->m_bot_count - 1;
        }
        pPVar4 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_28);
        if ((pPVar4->rdns_pending & 1U) != 0) {
          this->m_player_rdns_resolutions_pending = this->m_player_rdns_resolutions_pending - 1;
        }
        std::_List_const_iterator<RenX::PlayerInfo>::_List_const_iterator(&local_58,&local_28);
        std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::erase
                  (&this->players,local_58);
        return true;
      }
      std::_List_iterator<RenX::PlayerInfo>::operator++(&local_28);
    }
  }
  return false;
}

Assistant:

bool RenX::Server::removePlayer(int id) {
	if (this->players.size() == 0) {
		return false;
	}

	for (auto node = this->players.begin(); node != this->players.end(); ++node) {
		if (node->id == id) {
			for (auto plugin : RenX::getCore()->getPlugins()) {
				plugin->RenX_OnPlayerDelete(*this, *node);
			}

			if (node->isBot) {
				--m_bot_count;
			}

			if (node->rdns_pending) {
				--m_player_rdns_resolutions_pending;
			}

			this->players.erase(node);
			return true;
		}
	}

	return false;
}